

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_owner_name(archive_match *a,match_list *list,wchar_t mbs,void *name)

{
  match *m;
  archive_mstring *in_RCX;
  int in_EDX;
  match_list *in_RSI;
  long in_RDI;
  match *match;
  uint in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  m = (match *)calloc(1,0x78);
  if (m == (match *)0x0) {
    local_4 = error_nomem((archive_match *)0x11cf8d);
  }
  else {
    if (in_EDX == 0) {
      archive_mstring_copy_wcs
                ((archive_mstring *)(ulong)in_stack_ffffffffffffffe0,(wchar_t *)in_RCX);
    }
    else {
      archive_mstring_copy_mbs(in_RCX,(char *)m);
    }
    match_list_add(in_RSI,m);
    *(uint *)(in_RDI + 0x70) = *(uint *)(in_RDI + 0x70) | 4;
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
add_owner_name(struct archive_match *a, struct match_list *list,
    int mbs, const void *name)
{
	struct match *match;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	if (mbs)
		archive_mstring_copy_mbs(&(match->pattern), name);
	else
		archive_mstring_copy_wcs(&(match->pattern), name);
	match_list_add(list, match);
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}